

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
webfront::http::std::experimental::net::v1::detail::
op_queue<std::experimental::net::v1::detail::scheduler_operation>::~op_queue
          (op_queue<std::experimental::net::v1::detail::scheduler_operation> *this)

{
  noncopyable *in_RDI;
  scheduler_operation *op;
  
  while (*(op_queue<std::experimental::net::v1::detail::scheduler_operation> **)in_RDI !=
         (op_queue<std::experimental::net::v1::detail::scheduler_operation> *)0x0) {
    pop(*(op_queue<std::experimental::net::v1::detail::scheduler_operation> **)in_RDI);
    op_queue_access::destroy<std::experimental::net::v1::detail::scheduler_operation>
              ((scheduler_operation *)0x11277b);
  }
  noncopyable::~noncopyable(in_RDI);
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }